

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::to_function_name_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,TextureFunctionNameArguments *args)

{
  uint32_t id;
  Dim DVar1;
  SPIRType *type;
  bool bVar2;
  runtime_error *prVar3;
  uint uVar4;
  byte bVar5;
  string fname;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (args->has_min_lod == true) {
    if ((this->options).es == true) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"Sparse residency is not supported in ESSL.","");
      ::std::runtime_error::runtime_error(prVar3,(string *)&local_70);
      *(undefined ***)prVar3 = &PTR__runtime_error_003d4e98;
      __cxa_throw(prVar3,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"GL_ARB_sparse_texture_clamp","");
    require_extension_internal(this,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  type = (args->base).imgtype;
  id = (args->base).img.id;
  DVar1 = (type->image).dim;
  if (((((byte)(DVar1 == DimCube | DVar1 == Dim2D & (type->image).arrayed) == 1) &&
       (bVar2 = Compiler::is_depth_image(&this->super_Compiler,type,id), bVar2)) && (args->lod != 0)
      ) && ((args->base).is_fetch == false)) {
    bVar2 = expression_is_constant_null(this,args->lod);
    bVar5 = 1;
    if (!bVar2) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_50[0] = local_40;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,
                 "textureLod on sampler2DArrayShadow is not constant 0.0. This cannot be expressed in GLSL."
                 ,"");
      ::std::runtime_error::runtime_error(prVar3,(string *)local_50);
      *(undefined ***)prVar3 = &PTR__runtime_error_003d4e98;
      __cxa_throw(prVar3,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    bVar5 = 0;
  }
  if (args->is_sparse_feedback == true) {
    ::std::__cxx11::string::append((char *)&local_70);
  }
  if ((args->base).is_fetch != true) {
    ::std::__cxx11::string::append((char *)&local_70);
    if ((args->base).is_gather == true) {
      ::std::__cxx11::string::append((char *)&local_70);
    }
    if (args->has_array_offsets == true) {
      ::std::__cxx11::string::append((char *)&local_70);
    }
    if ((args->base).is_proj == true) {
      ::std::__cxx11::string::append((char *)&local_70);
    }
    if ((args->has_grad | bVar5) == 1) {
      ::std::__cxx11::string::append((char *)&local_70);
    }
    if (bVar5 != 0 || args->lod == 0) goto LAB_001f489b;
  }
  ::std::__cxx11::string::append((char *)&local_70);
LAB_001f489b:
  if (args->has_offset == true) {
    ::std::__cxx11::string::append((char *)&local_70);
  }
  if (args->has_min_lod == true) {
    ::std::__cxx11::string::append((char *)&local_70);
  }
  if ((args->is_sparse_feedback != false) || (args->has_min_lod == true)) {
    ::std::__cxx11::string::append((char *)&local_70);
  }
  uVar4 = 0x81;
  if ((this->options).es != false) {
    uVar4 = 299;
  }
  if ((uVar4 < (this->options).version) || ((args->base).is_gather != false)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_70._M_dataplus._M_p,
               local_70._M_dataplus._M_p + local_70._M_string_length);
  }
  else {
    legacy_tex_op(__return_storage_ptr__,this,&local_70,type,id);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_function_name(const TextureFunctionNameArguments &args)
{
	if (args.has_min_lod)
	{
		if (options.es)
			SPIRV_CROSS_THROW("Sparse residency is not supported in ESSL.");
		require_extension_internal("GL_ARB_sparse_texture_clamp");
	}

	string fname;
	auto &imgtype = *args.base.imgtype;
	VariableID tex = args.base.img;

	// textureLod on sampler2DArrayShadow and samplerCubeShadow does not exist in GLSL for some reason.
	// To emulate this, we will have to use textureGrad with a constant gradient of 0.
	// The workaround will assert that the LOD is in fact constant 0, or we cannot emit correct code.
	// This happens for HLSL SampleCmpLevelZero on Texture2DArray and TextureCube.
	bool workaround_lod_array_shadow_as_grad = false;
	if (((imgtype.image.arrayed && imgtype.image.dim == Dim2D) || imgtype.image.dim == DimCube) &&
	    is_depth_image(imgtype, tex) && args.lod && !args.base.is_fetch)
	{
		if (!expression_is_constant_null(args.lod))
		{
			SPIRV_CROSS_THROW("textureLod on sampler2DArrayShadow is not constant 0.0. This cannot be "
			                  "expressed in GLSL.");
		}
		workaround_lod_array_shadow_as_grad = true;
	}

	if (args.is_sparse_feedback)
		fname += "sparse";

	if (args.base.is_fetch)
		fname += args.is_sparse_feedback ? "TexelFetch" : "texelFetch";
	else
	{
		fname += args.is_sparse_feedback ? "Texture" : "texture";

		if (args.base.is_gather)
			fname += "Gather";
		if (args.has_array_offsets)
			fname += "Offsets";
		if (args.base.is_proj)
			fname += "Proj";
		if (args.has_grad || workaround_lod_array_shadow_as_grad)
			fname += "Grad";
		if (args.lod != 0 && !workaround_lod_array_shadow_as_grad)
			fname += "Lod";
	}

	if (args.has_offset)
		fname += "Offset";

	if (args.has_min_lod)
		fname += "Clamp";

	if (args.is_sparse_feedback || args.has_min_lod)
		fname += "ARB";

	return (is_legacy() && !args.base.is_gather) ? legacy_tex_op(fname, imgtype, tex) : fname;
}